

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::HierarchicalValueExpression::evalImpl
          (HierarchicalValueExpression *this,EvalContext *context)

{
  int iVar1;
  string_view arg;
  string_view arg_00;
  SourceRange range;
  SourceRange range_00;
  SourceRange referencingRange;
  bool bVar2;
  ConstantValue *this_00;
  Queue *pQVar3;
  SVQueue *this_01;
  EvalContext *in_RDX;
  EvalContext *in_RSI;
  Diagnostic *in_RDI;
  ParameterSymbol *in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  SpecparamSymbol *in_stack_00000098;
  SourceRange in_stack_000000a0;
  int32_t size;
  ConstantValue *target;
  ConstantValue v;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  HierarchicalReference *in_stack_fffffffffffffea0;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffea8;
  bitwidth_t bits;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffef0;
  byte bVar4;
  SourceLocation in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  DiagCode code;
  EnumValueSymbol *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffd8;
  bitmask<slang::ast::CompilationFlags> local_1c;
  EvalContext *local_18;
  
  code = SUB84((ulong)in_stack_ffffffffffffff00 >> 0x20,0);
  local_18 = in_RDX;
  bVar2 = HierarchicalReference::isViaIfacePort(in_stack_fffffffffffffea0);
  bVar4 = 0;
  if (!bVar2) {
    EvalContext::getCompilation((EvalContext *)0x825620);
    bitmask<slang::ast::CompilationFlags>::bitmask(&local_1c,AllowHierarchicalConst);
    bVar2 = Compilation::hasFlag
                      ((Compilation *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                       (bitmask<slang::ast::CompilationFlags>)
                       (underlying_type)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    bVar4 = 0;
    if (!bVar2) {
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffd8,ConfigParam);
      bVar2 = bitmask<slang::ast::ASTFlags>::has
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      bVar4 = bVar2 ^ 0xff;
    }
  }
  if ((bVar4 & 1) == 0) {
    bVar2 = ValueExpressionBase::checkConstantBase
                      ((ValueExpressionBase *)in_stack_fffffffffffffef8,
                       (EvalContext *)CONCAT17(bVar4,in_stack_fffffffffffffef0));
    if (bVar2) {
      iVar1 = *(int *)&((in_RSI->astCtx).assertionInstance)->symbol;
      if (iVar1 == 0xb) {
        Symbol::as<slang::ast::EnumValueSymbol>((Symbol *)0x825948);
        referencingRange.startLoc._4_4_ = in_stack_ffffffffffffffd4;
        referencingRange.startLoc._0_4_ = in_stack_ffffffffffffffd0;
        referencingRange.endLoc = (SourceLocation)in_stack_ffffffffffffffd8.m_bits;
        EnumValueSymbol::getValue(in_stack_ffffffffffffffc8,referencingRange);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffea0,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
      else if (iVar1 == 0x27) {
        Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x8257aa);
        ParameterSymbol::getValue(in_stack_00000048,(SourceRange)in_stack_00000050);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffea0,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        bVar2 = slang::ConstantValue::isUnbounded((ConstantValue *)0x8257f2);
        if ((bVar2) &&
           (this_00 = EvalContext::getQueueTarget(local_18), this_00 != (ConstantValue *)0x0)) {
          pQVar3 = slang::ConstantValue::queue((ConstantValue *)0x825842);
          bits = (bitwidth_t)((ulong)pQVar3 >> 0x20);
          this_01 = CopyPtr<slang::SVQueue>::operator->((CopyPtr<slang::SVQueue> *)0x825853);
          std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                    ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x825864)
          ;
          SVInt::SVInt((SVInt *)this_00,bits,(uint64_t)this_01,(bool)in_stack_fffffffffffffe9f);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)this_01,
                     (SVInt *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          SVInt::~SVInt((SVInt *)this_00);
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffea0,
                     (ConstantValue *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98))
          ;
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x825923);
      }
      else if (iVar1 == 0x4a) {
        Symbol::as<slang::ast::SpecparamSymbol>((Symbol *)0x82599d);
        SpecparamSymbol::getValue(in_stack_00000098,in_stack_000000a0);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffea0,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
      else {
        range_00.startLoc._7_1_ = bVar4;
        range_00.startLoc._0_7_ = in_stack_fffffffffffffef0;
        range_00.endLoc = in_stack_fffffffffffffef8;
        EvalContext::addDiag(in_RSI,code,range_00);
        arg_00._M_str._0_7_ = in_stack_fffffffffffffef0;
        arg_00._M_len = (size_t)in_RSI;
        arg_00._M_str._7_1_ = bVar4;
        Diagnostic::operator<<(in_RDI,arg_00);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffea0,
                   (nullptr_t)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffea0,
                 (nullptr_t)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    }
  }
  else {
    range.startLoc._7_1_ = bVar4;
    range.startLoc._0_7_ = in_stack_fffffffffffffef0;
    range.endLoc = in_stack_fffffffffffffef8;
    EvalContext::addDiag(in_RSI,code,range);
    arg._M_str._0_7_ = in_stack_fffffffffffffef0;
    arg._M_len = (size_t)in_RSI;
    arg._M_str._7_1_ = bVar4;
    Diagnostic::operator<<(in_RDI,arg);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffea0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue HierarchicalValueExpression::evalImpl(EvalContext& context) const {
    if (!ref.isViaIfacePort() &&
        !context.getCompilation().hasFlag(CompilationFlags::AllowHierarchicalConst) &&
        !context.astCtx.flags.has(ASTFlags::ConfigParam)) {
        context.addDiag(diag::ConstEvalHierarchicalName, sourceRange) << symbol.name;
        return nullptr;
    }

    if (!checkConstantBase(context))
        return nullptr;

    switch (symbol.kind) {
        case SymbolKind::Parameter: {
            auto v = symbol.as<ParameterSymbol>().getValue(sourceRange);
            if (v.isUnbounded()) {
                if (auto target = context.getQueueTarget()) {
                    int32_t size = (int32_t)target->queue()->size();
                    return SVInt(32, uint64_t(size - 1), true);
                }
            }
            return v;
        }
        case SymbolKind::EnumValue:
            return symbol.as<EnumValueSymbol>().getValue(sourceRange);
        case SymbolKind::Specparam:
            return symbol.as<SpecparamSymbol>().getValue(sourceRange);
        default:
            context.addDiag(diag::ConstEvalHierarchicalName, sourceRange) << symbol.name;
            return nullptr;
    }
}